

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Create.c
# Opt level: O3

tgestate_t * tge_create(zxspectrum_t *speccy)

{
  int iVar1;
  tgestate_t *__ptr;
  tileindex_t *__ptr_00;
  uint8_t *__ptr_01;
  supertileindex_t *__ptr_02;
  long lVar2;
  undefined8 *puVar3;
  movableitem_t *pmVar4;
  byte bVar5;
  
  bVar5 = 0;
  __ptr = (tgestate_t *)calloc(1,0x7b0);
  if (__ptr == (tgestate_t *)0x0) {
    __ptr_00 = (tileindex_t *)0x0;
    __ptr_01 = (uint8_t *)0x0;
    __ptr_02 = (supertileindex_t *)0x0;
  }
  else {
    iVar1 = (speccy->screen).height;
    __ptr->width = (speccy->screen).width;
    __ptr->height = iVar1;
    __ptr->columns = 0x18;
    __ptr->rows = 0x11;
    __ptr->st_columns = 7;
    __ptr->st_rows = 5;
    __ptr->tile_buf_size = 0x198;
    __ptr->window_buf_stride = 0xc0;
    __ptr->window_buf_size = 0xcc8;
    __ptr->map_buf_size = 0x23;
    __ptr_00 = (tileindex_t *)calloc(1,0x198);
    __ptr_01 = (uint8_t *)calloc(1,0xcc8);
    __ptr_02 = (supertileindex_t *)calloc(1,0x23);
    if (__ptr_02 != (supertileindex_t *)0x0 &&
        (__ptr_01 != (uint8_t *)0x0 && __ptr_00 != (tileindex_t *)0x0)) {
      __ptr->tile_buf = __ptr_00;
      __ptr->window_buf = __ptr_01;
      __ptr->map_buf = __ptr_02;
      __ptr->speccy = speccy;
      puVar3 = &tge_initialise_movable_items;
      pmVar4 = __ptr->movable_items;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        *(undefined8 *)pmVar4 = *puVar3;
        puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
        pmVar4 = (movableitem_t *)((long)pmVar4 + (ulong)bVar5 * -0x10 + 8);
      }
      memcpy(__ptr->character_structs,tge_initialise_character_structs,0xb6);
      memcpy(__ptr->item_structs,tge_initialise_item_structs,0x70);
      (__ptr->messages).queue[0] = 0xff;
      (__ptr->messages).queue[1] = 0xff;
      (__ptr->messages).queue[0x12] = 0xff;
      (__ptr->messages).display_index = 0x80;
      (__ptr->messages).queue_pointer = (__ptr->messages).queue + 2;
      __ptr->bell = 0xff;
      __ptr->morale = 'p';
      __ptr->moraleflag_screen_address = (speccy->screen).pixels + 0x1002;
      __ptr->red_cross_parcel_current_contents = 0xff;
      (__ptr->searchlight).states[0].xy.x = '$';
      (__ptr->searchlight).states[0].xy.y = 'R';
      (__ptr->searchlight).states[0].counter = ',';
      (__ptr->searchlight).states[0].direction = '\x02';
      (__ptr->searchlight).states[0].index = '\0';
      *(undefined3 *)&(__ptr->searchlight).states[0].field_0x5 = 0;
      (__ptr->searchlight).states[0].ptr = (uint8_t *)0x10ed21;
      (__ptr->searchlight).states[1].xy.x = 'x';
      (__ptr->searchlight).states[1].xy.y = 'R';
      (__ptr->searchlight).states[1].counter = '\x18';
      (__ptr->searchlight).states[1].direction = '\x01';
      (__ptr->searchlight).states[1].index = '\0';
      *(undefined3 *)&(__ptr->searchlight).states[1].field_0x5 = 0;
      (__ptr->searchlight).states[1].ptr = (uint8_t *)0x10ed10;
      (__ptr->searchlight).states[2].xy.x = '<';
      (__ptr->searchlight).states[2].xy.y = 'L';
      (__ptr->searchlight).states[2].counter = ' ';
      (__ptr->searchlight).states[2].direction = '\x02';
      (__ptr->searchlight).states[2].index = '\0';
      *(undefined3 *)&(__ptr->searchlight).states[2].field_0x5 = 0;
      (__ptr->searchlight).states[2].ptr = (uint8_t *)0x10ed00;
      __ptr->bribed_character = 0xff;
      builtin_memcpy(__ptr->item_attributes,"\x06\x05\x05\a\x04B\x04\a\x03B\x06\x04\x05\a\a\x04",
                     0x10);
      __ptr->locked_doors[0] = 0x80;
      __ptr->locked_doors[1] = 0x81;
      __ptr->locked_doors[2] = 0x8d;
      __ptr->locked_doors[3] = 0x8c;
      __ptr->locked_doors[4] = 0x8e;
      __ptr->locked_doors[5] = 0xa2;
      __ptr->locked_doors[6] = 0x98;
      __ptr->locked_doors[7] = 0x9f;
      __ptr->locked_doors[7] = 0x9f;
      __ptr->locked_doors[8] = 0x96;
      __ptr->locked_doors[9] = '\0';
      __ptr->locked_doors[10] = '\0';
      builtin_memcpy(__ptr->roomdef_shadow_bytes,"\x17\x17\x17\x17\x17\x17\x17\r\r\r\r\r\r\r4\x14",
                     0x10);
      return __ptr;
    }
  }
  free(__ptr_02);
  free(__ptr_01);
  free(__ptr_00);
  free(__ptr);
  return (tgestate_t *)0x0;
}

Assistant:

TGE_API tgestate_t *tge_create(zxspectrum_t *speccy)
{
  tgestate_t       *state      = NULL;
  size_t            tile_buf_size;
  size_t            window_buf_stride;
  size_t            window_buf_size;
  size_t            map_buf_size;
  tileindex_t      *tile_buf   = NULL;
  uint8_t          *window_buf = NULL;
  supertileindex_t *map_buf    = NULL;

  /* Allocate state structure. */

  state = calloc(1, sizeof(*state));
  if (state == NULL)
    goto failure;

  /* Configure. */

  // Until we can resize...
  assert(speccy->screen.width  == 32);
  assert(speccy->screen.height == 24);

  state->width      = speccy->screen.width;
  state->height     = speccy->screen.height;

  /* Set the dimensions of the window buffer. When painted onto the game
   * screen the window is one unit smaller in both dimensions. That is a
   * 24x17 buffer is displayed through a 23x16 window on-screen. This allows
   * for rolling/scrolling. */
  state->columns    = 24;
  state->rows       = 17;

  /* Set the dimensions of the supertile buffer. This is held separately,
   * rather than computed from columns and rows, as it's wider than I
   * expected it to be. */
  state->st_columns = 7; // try  = (state->columns + 1) / 4; /* +1 is a fudge */
  state->st_rows    = 5; // try  = (state->rows       ) / 4;

  /* Size and allocate buffers. */

  tile_buf_size     = state->columns * state->rows;
  window_buf_stride = state->columns * 8;
  /* 8 bytes of padding are appended to the end of the window buffer - the
   * same as in the original game - to allow for plotting routine overruns.
   */
  window_buf_size   = window_buf_stride * state->rows + 8;
  map_buf_size      = state->st_columns * state->st_rows;

  state->tile_buf_size     = tile_buf_size;
  state->window_buf_stride = window_buf_stride;
  state->window_buf_size   = window_buf_size;
  state->map_buf_size      = map_buf_size;

  tile_buf   = calloc(1, tile_buf_size);
  window_buf = calloc(1, window_buf_size);
  map_buf    = calloc(1, map_buf_size);

  if (tile_buf   == NULL ||
      window_buf == NULL ||
      map_buf    == NULL)
    goto failure;

  state->tile_buf   = tile_buf;
  state->window_buf = window_buf;
  state->map_buf    = map_buf;

  state->prng_index = 0;

  /* Initialise additional variables. */

  state->speccy = speccy;

  /* Initialise original game variables. */

  tge_initialise(state);

  return state;


failure:

  free(map_buf);
  free(window_buf);
  free(tile_buf);
  free(state);

  return NULL;
}